

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_reader_tests.cpp
# Opt level: O0

void check_decode_bson(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  bool bVar1;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&> EVar2;
  size_type in_RDI;
  AssertionHandler catchAssertionHandler_1;
  json j2;
  istringstream is;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  string s;
  AssertionHandler catchAssertionHandler;
  json result;
  undefined4 in_stack_fffffffffffffc28;
  Flags in_stack_fffffffffffffc2c;
  AssertionHandler *in_stack_fffffffffffffc30;
  StringRef *in_stack_fffffffffffffc38;
  SourceLineInfo *this;
  AssertionHandler *in_stack_fffffffffffffc40;
  SourceLineInfo *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffc68;
  SourceLineInfo local_350;
  StringRef local_340;
  istringstream local_2c0 [176];
  bson_decode_options *in_stack_fffffffffffffdf0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdf8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_130 [2];
  string local_120 [40];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_f8;
  SourceLineInfo local_b0;
  StringRef local_a0;
  bson_decode_options *in_stack_ffffffffffffff70;
  istream *in_stack_ffffffffffffff78;
  
  jsoncons::bson::bson_decode_options::bson_decode_options
            ((bson_decode_options *)in_stack_fffffffffffffc30);
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  jsoncons::bson::bson_decode_options::~bson_decode_options
            ((bson_decode_options *)in_stack_fffffffffffffc30);
  local_a0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffc30,
                        CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  this_00 = &local_b0;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_reader_tests.cpp"
             ,0x13);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
  capturedExpression.m_size = in_RDI;
  capturedExpression.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (SourceLineInfo *)in_stack_fffffffffffffc30,capturedExpression,
             in_stack_fffffffffffffc2c);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2354f6);
  local_f8 = EVar2.m_lhs;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffc30,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x23554d);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc30);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc30);
  std::__cxx11::string::string(local_120);
  local_130[0]._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffc30,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(local_130);
    std::__cxx11::string::push_back((char)local_120);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(local_130);
  }
  std::__cxx11::istringstream::istringstream(local_2c0,local_120,_S_in);
  jsoncons::bson::bson_decode_options::bson_decode_options
            ((bson_decode_options *)in_stack_fffffffffffffc30);
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  jsoncons::bson::bson_decode_options::~bson_decode_options
            ((bson_decode_options *)in_stack_fffffffffffffc30);
  local_340 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffc30,
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  this = &local_350;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_reader_tests.cpp"
             ,0x1c);
  Catch::StringRef::StringRef((StringRef *)EVar2.m_lhs,(char *)this);
  capturedExpression_00.m_size = in_RDI;
  capturedExpression_00.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)EVar2.m_lhs,(StringRef *)this,
             (SourceLineInfo *)in_stack_fffffffffffffc30,capturedExpression_00,
             in_stack_fffffffffffffc2c);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2357f4);
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)EVar2.m_lhs,in_stack_fffffffffffffc60);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)EVar2.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x23583c);
  Catch::AssertionHandler::complete((AssertionHandler *)EVar2.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)EVar2.m_lhs);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x23591d);
  std::__cxx11::istringstream::~istringstream(local_2c0);
  std::__cxx11::string::~string(local_120);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x235944);
  return;
}

Assistant:

void check_decode_bson(const std::vector<uint8_t>& v, const json& expected)
{
    json result = bson::decode_bson<json>(v);
    REQUIRE(result == expected);

    std::string s;
    for (auto c : v)
    {
        s.push_back(c);
    }
    std::istringstream is(s);
    json j2 = bson::decode_bson<json>(is);
    REQUIRE(j2 == expected);
}